

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

lest * __thiscall lest::transformed_abi_cxx11_(lest *this,char chr)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  allocator local_a7;
  undefined1 local_a6;
  anon_class_1_0_00000001 local_a5 [7];
  anon_class_1_0_00000001 to_hex_string;
  anon_class_1_0_00000001 unprintable;
  allocator local_91;
  undefined8 local_90;
  Tr tr;
  Tr *__end1;
  Tr *__begin1;
  Tr (*__range1) [5];
  Tr table [5];
  char chr_local;
  
  table[4].str._7_1_ = chr;
  memcpy(&__range1,&DAT_0011fbe0,0x50);
  __end1 = (Tr *)&__range1;
  tr.str = (char *)&table[4].str;
  while( true ) {
    if (__end1 == (Tr *)tr.str) {
      bVar3 = transformed::anon_class_1_0_00000001::operator()(local_a5,table[4].str._7_1_);
      cVar2 = table[4].str._7_1_;
      if (bVar3) {
        transformed[abi:cxx11](char)::{lambda(char)#2}::operator()[abi_cxx11_
                  ((_lambda_char__2_ *)this,(char)&local_a6);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)this,1,cVar2,&local_a7);
        std::allocator<char>::~allocator((allocator<char> *)&local_a7);
      }
      return this;
    }
    local_90 = *(undefined8 *)__end1;
    pcVar1 = __end1->str;
    tr._0_8_ = pcVar1;
    if (table[4].str._7_1_ == (char)local_90) break;
    __end1 = __end1 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,pcVar1,&local_91);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return this;
}

Assistant:

inline std::string transformed( char chr )
{
    struct Tr { char chr; char const * str; } table[] =
    {
        {'\\', "\\\\" },
        {'\r', "\\r"  }, {'\f', "\\f" },
        {'\n', "\\n"  }, {'\t', "\\t" },
    };

    for ( auto tr : table )
    {
        if ( chr == tr.chr )
            return tr.str;
    }

    // The cast below helps suppress warnings ("-Wtype-limits" on GCC) on architectures where `char` is unsigned.
    auto unprintable = [](char c){ return 0 <= static_cast<signed char>(c) && c < ' '; };

    auto to_hex_string = [](char c)
    {
        std::ostringstream os;
        os << "\\x" << std::hex << std::setw(2) << std::setfill('0') << static_cast<int>( static_cast<unsigned char>(c) );
        return os.str();
    };

    return unprintable( chr  ) ? to_hex_string( chr ) : std::string( 1, chr );
}